

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SMBusSimulationDataGenerator::Initialize
          (SMBusSimulationDataGenerator *this,U32 simulation_sample_rate,
          SMBusAnalyzerSettings *settings)

{
  SimulationChannelDescriptorGroup *pSVar1;
  SimulationChannelDescriptor *pSVar2;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init(50000.0,(int)this + 0x10);
  pSVar1 = &this->mSMBSimulationChannels;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x10,this->mSimulationSampleRateHz);
  this->mSMBDAT = pSVar2;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x20,this->mSimulationSampleRateHz);
  this->mSMBCLK = pSVar2;
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((uint)pSVar1);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SMBusAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    // 50KHz, but it's not really used for AdvanceByHalfPeriod
    mClockGenerator.Init( 50000, simulation_sample_rate );

    mSMBDAT = mSMBSimulationChannels.Add( settings->mSMBDAT, mSimulationSampleRateHz, BIT_HIGH );
    mSMBCLK = mSMBSimulationChannels.Add( settings->mSMBCLK, mSimulationSampleRateHz, BIT_HIGH );

    AdvanceAllBySec( ONE_MS * 0.5 ); // insert a pause before we start
}